

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
TempChatBanGameCommand::trigger
          (TempChatBanGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  PlayerInfo *pPVar1;
  char *pcVar2;
  undefined4 uVar3;
  long lVar4;
  basic_string_view<char,_std::char_traits<char>_> *args_2;
  undefined4 uVar5;
  long lVar6;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar7;
  undefined8 uStackY_f0;
  rep local_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  split_parameters;
  undefined4 local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  args_2 = (basic_string_view<char,_std::char_traits<char>_> *)parameters._M_str;
  local_70._M_dataplus._M_p = (pointer)parameters._M_len;
  local_80._M_len = 2;
  local_80._M_str = " \t";
  local_70._M_string_length = (size_type)args_2;
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&split_parameters,(basic_string_view<char,_std::char_traits<char>_> *)&local_70,
             &local_80);
  uVar3 = split_parameters.second._M_str._0_4_;
  lVar4 = CONCAT44(split_parameters.first._M_len._4_4_,(undefined4)split_parameters.first._M_len);
  if (lVar4 == 0) {
    pcVar2 = "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]";
    uStackY_f0 = 0x48;
    goto LAB_001341a0;
  }
  pcVar2 = (char *)CONCAT44(split_parameters.first._M_str._4_4_,split_parameters.first._M_str._0_4_)
  ;
  lVar6 = CONCAT44(split_parameters.second._M_len._4_4_,(undefined4)split_parameters.second._M_len);
  local_c0 = pluginInstance.m_defaultTempBanTime.__r;
  pPVar1 = (PlayerInfo *)RenX::Server::getPlayerByPartName(source,lVar4,pcVar2);
  if (pPVar1 == (PlayerInfo *)0x0) {
    if (CONCAT44(split_parameters.second._M_len._4_4_,(undefined4)split_parameters.second._M_len) !=
        0) {
      dVar7 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (pcVar2,pcVar2 + lVar4);
      local_c0 = (rep)dVar7.duration.__r;
      if (0 < local_c0) {
        if (pluginInstance.m_maxTempBanTime.__r < local_c0) {
          local_c0 = pluginInstance.m_maxTempBanTime.__r;
        }
        local_80._M_len = 2;
        local_80._M_str = " \t";
        jessilib::
        word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&local_70,&split_parameters.second,&local_80);
        split_parameters.first._M_len._0_4_ = local_70._M_dataplus._M_p._0_4_;
        split_parameters.first._M_len._4_4_ = local_70._M_dataplus._M_p._4_4_;
        split_parameters.first._M_str._0_4_ = (undefined4)local_70._M_string_length;
        split_parameters.first._M_str._4_4_ = local_70._M_string_length._4_4_;
        split_parameters.second._M_len._0_4_ = local_70.field_2._M_allocated_capacity._0_4_;
        split_parameters.second._M_len._4_4_ = local_70.field_2._M_allocated_capacity._4_4_;
        split_parameters.second._M_str._0_4_ = local_70.field_2._8_4_;
        split_parameters.second._M_str._4_4_ = local_70.field_2._12_4_;
        lVar6 = CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                         local_70.field_2._M_allocated_capacity._0_4_);
        pPVar1 = (PlayerInfo *)
                 RenX::Server::getPlayerByPartName
                           (source,local_70._M_dataplus._M_p,local_70._M_string_length);
        uVar3 = local_70.field_2._8_4_;
        goto LAB_001340ee;
      }
    }
    pPVar1 = (PlayerInfo *)0x0;
  }
LAB_001340ee:
  uVar5 = 0x13cb77;
  if (lVar6 != 0) {
    uVar5 = uVar3;
  }
  lVar4 = 9;
  if (lVar6 != 0) {
    lVar4 = lVar6;
  }
  if (pPVar1 == (PlayerInfo *)0x0) {
    pcVar2 = "Error: Player not found.";
    uStackY_f0 = 0x18;
  }
  else if (pPVar1 == player) {
    pcVar2 = "Error: You can not ban yourself.";
    uStackY_f0 = 0x20;
  }
  else {
    if (player->access <= pPVar1->access) {
      local_80._M_len = 0x24;
      local_80._M_str = "Error: You can not ban higher level ";
      local_40._M_len = pluginInstance.m_staffTitle._M_string_length;
      local_40._M_str = pluginInstance.m_staffTitle._M_dataplus._M_p;
      local_50._M_len = 2;
      local_50._M_str = "s.";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                (&local_70,(jessilib *)&local_80,&local_40,&local_50,args_2);
      RenX::Server::sendMessage(source,player,local_70._M_string_length,local_70._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_70);
      return;
    }
    RenX::Server::mute((PlayerInfo *)source);
    local_90 = (undefined4)lVar4;
    RenX::BanDatabase::add
              (RenX::banDatabase,source,pPVar1,(player->name)._M_string_length,
               (player->name)._M_dataplus._M_p,local_c0,local_90,uVar5,0x40);
    pcVar2 = "Player has been temporarily muted and chat banned from the game.";
    uStackY_f0 = 0x40;
  }
LAB_001341a0:
  RenX::Server::sendMessage(source,player,uStackY_f0,pcVar2);
  return;
}

Assistant:

void TempChatBanGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto split_parameters = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!split_parameters.first.empty()) {
		std::string_view name = split_parameters.first;
		std::chrono::seconds duration = pluginInstance.getDefaultTBanTime();
		std::string_view reason = split_parameters.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target == nullptr
			&& !split_parameters.second.empty()) {
			// Try reading first token as duration
			duration = jessilib::duration_from_string(name.data(), name.data() + name.size()).duration;
			if (duration.count() > 0) {
				duration = std::min(duration, pluginInstance.getMaxTBanTime());
				split_parameters = jessilib::word_split_once_view(split_parameters.second, WHITESPACE_SV);
				name = split_parameters.first;
				reason = split_parameters.second;
				target = source->getPlayerByPartName(name);
			}
		}

		if (reason.empty()) {
			reason = "No reason"sv;
		}

		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (player == target)
			source->sendMessage(*player, "Error: You can not ban yourself."sv);
		else if (target->access >= player->access)
			source->sendMessage(*player, jessilib::join<std::string>("Error: You can not ban higher level "sv, pluginInstance.getStaffTitle(), "s."sv));
		else {
			source->mute(*target);
			RenX::banDatabase->add(source, *target, player->name, reason, duration, RenX::BanDatabase::Entry::FLAG_TYPE_CHAT);
			source->sendMessage(*player, "Player has been temporarily muted and chat banned from the game."sv);
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: tchatban [Duration] <player> [Reason]"sv);
}